

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageUtil.cpp
# Opt level: O0

MovePtr<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_> *
deqp::egl::Image::createUnsupportedImageSource
          (MovePtr<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
           *__return_storage_ptr__,string *message,GLenum format)

{
  UnsupportedImageSource *this;
  DefaultDeleter<deqp::egl::Image::ImageSource> local_2d [17];
  GLenum local_1c;
  string *psStack_18;
  GLenum format_local;
  string *message_local;
  
  local_1c = format;
  psStack_18 = message;
  message_local = (string *)__return_storage_ptr__;
  this = (UnsupportedImageSource *)operator_new(0x30);
  UnsupportedImageSource::UnsupportedImageSource(this,psStack_18,local_1c);
  de::DefaultDeleter<deqp::egl::Image::ImageSource>::DefaultDeleter(local_2d);
  de::details::
  MovePtr<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>::
  MovePtr(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

MovePtr<ImageSource> createUnsupportedImageSource (const string& message, GLenum format)
{
	return MovePtr<ImageSource>(new UnsupportedImageSource(message, format));
}